

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionMatching.cpp
# Opt level: O1

bool is_no_ll_fpr_store(Instruction *instr,MatchParam<Register> src,MatchParam<int> offset,
                       MatchParam<Register> dest)

{
  bool bVar1;
  int32_t iVar2;
  Register local_1c;
  Register local_1a;
  MatchParam<Register> local_18;
  MatchParam<Register> local_14;
  
  if (instr->kind == SWC1) {
    local_18 = dest;
    local_14 = src;
    local_1a = InstructionAtom::get_reg(instr->src);
    if (((local_14.is_wildcard != false) ||
        (bVar1 = Register::operator==(&local_14.value,&local_1a), bVar1)) &&
       ((iVar2 = InstructionAtom::get_imm(instr->src + 1), ((ulong)offset >> 0x20 & 1) != 0 ||
        (iVar2 == offset.value)))) {
      local_1c = InstructionAtom::get_reg(instr->src + 2);
      if (local_18.is_wildcard != false) {
        return true;
      }
      bVar1 = Register::operator==(&local_18.value,&local_1c);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool is_no_ll_fpr_store(const Instruction& instr,
                        MatchParam<Register> src,
                        MatchParam<int> offset,
                        MatchParam<Register> dest) {
  return instr.kind == InstructionKind::SWC1 && src == instr.src[0].get_reg() &&
         offset == instr.src[1].get_imm() && dest == instr.src[2].get_reg();
}